

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O1

void __thiscall MutableBuffer::check_size(MutableBuffer *this,size_t _size)

{
  void *pvVar1;
  undefined8 *puVar2;
  ulong __size;
  
  if (this->reserved < _size) {
    pvVar1 = (this->super_Buffer).data;
    __size = this->growth + (this->super_Buffer).size;
    if (__size <= _size) {
      __size = _size;
    }
    if (pvVar1 == (void *)0x0) {
      pvVar1 = malloc(__size);
      (this->super_Buffer).data = pvVar1;
      (this->super_Buffer).size = 0;
      (this->super_Buffer).owned = true;
    }
    else {
      pvVar1 = realloc(pvVar1,__size);
      if (pvVar1 == (void *)0x0) {
        puVar2 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar2 = QWidget::backgroundRole;
        __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      (this->super_Buffer).data = pvVar1;
    }
    this->reserved = __size;
  }
  return;
}

Assistant:

void
MutableBuffer::check_size(size_t _size) {
  if (reserved >= _size) {
    return;
  }

  size_t _reserved = std::max(size + growth, _size);

  if (data == nullptr) {
    data = ::malloc(_reserved);
    size = 0;
    owned = true;
  } else {
    void *new_data = ::realloc(data, _reserved);
    if (new_data == nullptr) {
      throw std::bad_alloc();
    }
    data = new_data;
  }

  reserved = _reserved;
}